

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O3

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set,uint64_t sequence)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  en_quicly_local_cid_state_t eVar11;
  undefined4 uVar12;
  en_quicly_local_cid_state_t eVar13;
  undefined4 uVar14;
  quicly_local_cid_t *pqVar15;
  long lVar16;
  quicly_local_cid_t *pqVar17;
  bool bVar18;
  quicly_local_cid_t tmp;
  
  pqVar17 = set->cids;
  if (set->_size != 0) {
    lVar16 = 0;
    pqVar15 = pqVar17;
    do {
      if (pqVar15->sequence == sequence) {
        if ((lVar16 != 1) && (pqVar15->state != QUICLY_LOCAL_CID_STATE_DELIVERED)) {
          pqVar15->state = QUICLY_LOCAL_CID_STATE_PENDING;
          bVar18 = true;
          if (lVar16 == 0) goto LAB_0013103c;
          lVar16 = -lVar16;
          goto LAB_00131050;
        }
        break;
      }
      lVar16 = lVar16 + -1;
      pqVar15 = pqVar15 + 1;
    } while (-lVar16 != set->_size);
  }
  bVar18 = pqVar17->state == QUICLY_LOCAL_CID_STATE_PENDING;
  goto LAB_0013103c;
  while( true ) {
    pqVar17 = pqVar17 + 1;
    lVar16 = lVar16 + -1;
    if (lVar16 == 0) break;
LAB_00131050:
    if (pqVar17->state != QUICLY_LOCAL_CID_STATE_PENDING) {
      uVar1 = *(undefined8 *)(pqVar17->stateless_reset_token + 0xb);
      eVar13 = pqVar17->state;
      uVar14 = *(undefined4 *)&pqVar17->field_0x4;
      uVar2 = pqVar17->sequence;
      uVar3 = *(undefined8 *)(pqVar17->cid).cid;
      uVar4 = *(undefined8 *)((pqVar17->cid).cid + 8);
      uVar5 = *(undefined8 *)((pqVar17->cid).cid + 0x10);
      uVar6 = *(undefined8 *)(pqVar17->stateless_reset_token + 3);
      *(undefined8 *)(pqVar17->stateless_reset_token + 0xb) =
           *(undefined8 *)(pqVar15->stateless_reset_token + 0xb);
      eVar11 = pqVar15->state;
      uVar12 = *(undefined4 *)&pqVar15->field_0x4;
      uVar7 = pqVar15->sequence;
      uVar8 = *(undefined8 *)(pqVar15->cid).cid;
      uVar9 = *(undefined8 *)((pqVar15->cid).cid + 8);
      uVar10 = *(undefined8 *)(pqVar15->stateless_reset_token + 3);
      *(undefined8 *)((pqVar17->cid).cid + 0x10) = *(undefined8 *)((pqVar15->cid).cid + 0x10);
      *(undefined8 *)(pqVar17->stateless_reset_token + 3) = uVar10;
      *(undefined8 *)(pqVar17->cid).cid = uVar8;
      *(undefined8 *)((pqVar17->cid).cid + 8) = uVar9;
      pqVar17->state = eVar11;
      *(undefined4 *)&pqVar17->field_0x4 = uVar12;
      pqVar17->sequence = uVar7;
      *(undefined8 *)(pqVar15->stateless_reset_token + 0xb) = uVar1;
      *(undefined8 *)((pqVar15->cid).cid + 0x10) = uVar5;
      *(undefined8 *)(pqVar15->stateless_reset_token + 3) = uVar6;
      *(undefined8 *)(pqVar15->cid).cid = uVar3;
      *(undefined8 *)((pqVar15->cid).cid + 8) = uVar4;
      pqVar15->state = eVar13;
      *(undefined4 *)&pqVar15->field_0x4 = uVar14;
      pqVar15->sequence = uVar2;
      break;
    }
  }
LAB_0013103c:
  return (int)bVar18;
}

Assistant:

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return has_pending(set);

    /* if it's already delivered, ignore the packet loss event (no need for retransmission) */
    if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_DELIVERED)
        return has_pending(set);

    do_mark_pending(set, i);

    return 1;
}